

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteTranslational::ChLinkRevoluteTranslational
          (ChLinkRevoluteTranslational *this,ChLinkRevoluteTranslational *other)

{
  int i;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar3;
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevoluteTranslational_00b45728;
  (this->m_p1).m_data[0] = 0.0;
  (this->m_p1).m_data[1] = 0.0;
  (this->m_p1).m_data[2] = 0.0;
  (this->m_p2).m_data[0] = 0.0;
  (this->m_p2).m_data[1] = 0.0;
  (this->m_p2).m_data[2] = 0.0;
  (this->m_z1).m_data[0] = 0.0;
  (this->m_z1).m_data[1] = 0.0;
  (this->m_z1).m_data[1] = 0.0;
  (this->m_z1).m_data[2] = 0.0;
  (this->m_x2).m_data[0] = 0.0;
  (this->m_x2).m_data[1] = 0.0;
  (this->m_x2).m_data[2] = 0.0;
  (this->m_y2).m_data[0] = 0.0;
  (this->m_y2).m_data[1] = 0.0;
  (this->m_y2).m_data[2] = 0.0;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_par1);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_par2);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dist);
  (this->super_ChLink).Body1 = (other->super_ChLink).Body1;
  (this->super_ChLink).Body2 = (other->super_ChLink).Body2;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  if (other != this) {
    (this->m_p1).m_data[0] = (other->m_p1).m_data[0];
    (this->m_p1).m_data[1] = (other->m_p1).m_data[1];
    (this->m_p1).m_data[2] = (other->m_p1).m_data[2];
    (this->m_p2).m_data[0] = (other->m_p2).m_data[0];
    (this->m_p2).m_data[1] = (other->m_p2).m_data[1];
    (this->m_p2).m_data[2] = (other->m_p2).m_data[2];
    (this->m_z1).m_data[0] = (other->m_z1).m_data[0];
    (this->m_z1).m_data[1] = (other->m_z1).m_data[1];
    (this->m_z1).m_data[2] = (other->m_z1).m_data[2];
    (this->m_x2).m_data[0] = (other->m_x2).m_data[0];
    (this->m_x2).m_data[1] = (other->m_x2).m_data[1];
    (this->m_x2).m_data[2] = (other->m_x2).m_data[2];
    (this->m_y2).m_data[0] = (other->m_y2).m_data[0];
    (this->m_y2).m_data[1] = (other->m_y2).m_data[1];
    (this->m_y2).m_data[2] = (other->m_y2).m_data[2];
  }
  this->m_dist = other->m_dist;
  this->m_cur_par1 = other->m_cur_par1;
  this->m_cur_par2 = other->m_cur_par2;
  this->m_cur_dot = other->m_cur_dot;
  this->m_cur_dist = other->m_cur_dist;
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar1),
             (ChVariables *)CONCAT44(extraout_var_00,iVar2));
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar1),
             (ChVariables *)CONCAT44(extraout_var_02,iVar2));
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar1),
             (ChVariables *)CONCAT44(extraout_var_04,iVar2));
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar1),
             (ChVariables *)CONCAT44(extraout_var_06,iVar2));
  lVar3 = 0;
  do {
    this->m_multipliers[lVar3] = other->m_multipliers[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

ChLinkRevoluteTranslational::ChLinkRevoluteTranslational(const ChLinkRevoluteTranslational& other) : ChLink(other) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;

    m_p1 = other.m_p1;
    m_p2 = other.m_p2;
    m_z1 = other.m_z1;
    m_x2 = other.m_x2;
    m_y2 = other.m_y2;
    m_dist = other.m_dist;
    m_cur_par1 = other.m_cur_par1;
    m_cur_par2 = other.m_cur_par2;
    m_cur_dot = other.m_cur_dot;
    m_cur_dist = other.m_cur_dist;

    m_cnstr_par1.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_par2.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_dot.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_dist.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());

    for (int i = 0; i < 4; i++) {
        m_multipliers[i] = other.m_multipliers[i];
    }
}